

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_MAC_Poly1305_Simd128.c
# Opt level: O3

void Hacl_MAC_Poly1305_Simd128_fmul_r2_normalize
               (Lib_IntVector_Intrinsics_vec128 *out,Lib_IntVector_Intrinsics_vec128 *p)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  long lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  long lVar42;
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  
  uVar9 = (uint)(*out)[0];
  uVar10 = (uint)(*out)[1];
  uVar11 = (uint)out[1][0];
  uVar12 = (uint)out[1][1];
  uVar13 = (uint)out[2][0];
  uVar14 = (uint)out[2][1];
  uVar15 = p[10][0];
  uVar16 = p[0xb][0];
  uVar17 = p[0xc][0];
  uVar18 = p[0xd][0];
  uVar1 = (*p)[0];
  uVar2 = p[1][0];
  uVar3 = p[2][0];
  uVar4 = p[3][0];
  uVar5 = uVar18 * 5;
  uVar7 = uVar4 * 5;
  uVar6 = p[0xe][0] * 5;
  uVar8 = p[4][0] * 5;
  uVar19 = (uint)out[3][0];
  uVar20 = (uint)out[3][1];
  uVar21 = (uint)out[4][0];
  uVar22 = (uint)out[4][1];
  auVar40._0_8_ =
       (uVar16 * 5 & 0xffffffff) * (ulong)uVar21 + (uVar15 & 0xffffffff) * (ulong)uVar9 +
       (uVar17 * 5 & 0xffffffff) * (ulong)uVar19 + (uVar5 & 0xffffffff) * (ulong)uVar13 +
       (uVar6 & 0xffffffff) * (ulong)uVar11;
  auVar40._8_8_ =
       (uVar2 * 5 & 0xffffffff) * (ulong)uVar22 + (uVar1 & 0xffffffff) * (ulong)uVar10 +
       (uVar3 * 5 & 0xffffffff) * (ulong)uVar20 + (uVar7 & 0xffffffff) * (ulong)uVar14 +
       (uVar8 & 0xffffffff) * (ulong)uVar12;
  auVar43._0_8_ =
       (uVar6 & 0xffffffff) * (ulong)uVar21 +
       (uVar15 & 0xffffffff) * (ulong)uVar19 + (uVar16 & 0xffffffff) * (ulong)uVar13 +
       (uVar17 & 0xffffffff) * (ulong)uVar11 + (uVar18 & 0xffffffff) * (ulong)uVar9;
  auVar43._8_8_ =
       (uVar8 & 0xffffffff) * (ulong)uVar22 +
       (uVar1 & 0xffffffff) * (ulong)uVar20 + (uVar2 & 0xffffffff) * (ulong)uVar14 +
       (uVar3 & 0xffffffff) * (ulong)uVar12 + (uVar4 & 0xffffffff) * (ulong)uVar10;
  auVar27._0_8_ =
       (uVar15 & 0xffffffff) * (ulong)uVar21 + (uVar16 & 0xffffffff) * (ulong)uVar19 +
       (uVar17 & 0xffffffff) * (ulong)uVar13 + (uVar18 & 0xffffffff) * (ulong)uVar11 +
       (p[0xe][0] & 0xffffffffU) * (ulong)uVar9;
  auVar27._8_8_ =
       (uVar1 & 0xffffffff) * (ulong)uVar22 + (uVar2 & 0xffffffff) * (ulong)uVar20 +
       (uVar3 & 0xffffffff) * (ulong)uVar14 + (uVar4 & 0xffffffff) * (ulong)uVar12 +
       (p[4][0] & 0xffffffffU) * (ulong)uVar10;
  auVar31._0_8_ =
       (auVar40._0_8_ >> 0x1a) +
       (uVar17 * 5 & 0xffffffff) * (ulong)uVar21 +
       (uVar15 & 0xffffffff) * (ulong)uVar11 + (uVar16 & 0xffffffff) * (ulong)uVar9 +
       (uVar5 & 0xffffffff) * (ulong)uVar19 + (uVar6 & 0xffffffff) * (ulong)uVar13;
  auVar31._8_8_ =
       (auVar40._8_8_ >> 0x1a) +
       (uVar3 * 5 & 0xffffffff) * (ulong)uVar22 +
       (uVar1 & 0xffffffff) * (ulong)uVar12 + (uVar2 & 0xffffffff) * (ulong)uVar10 +
       (uVar7 & 0xffffffff) * (ulong)uVar20 + (uVar8 & 0xffffffff) * (ulong)uVar14;
  auVar29._0_8_ = (auVar43._0_8_ >> 0x1a) + auVar27._0_8_;
  auVar29._8_8_ = (auVar43._8_8_ >> 0x1a) + auVar27._8_8_;
  auVar27 = pmovsxdq(auVar27,0x3ffffff03ffffff);
  auVar28._0_8_ =
       (auVar31._0_8_ >> 0x1a) +
       (uVar5 & 0xffffffff) * (ulong)uVar21 +
       (uVar15 & 0xffffffff) * (ulong)uVar13 + (uVar16 & 0xffffffff) * (ulong)uVar11 +
       (uVar17 & 0xffffffff) * (ulong)uVar9 + (uVar6 & 0xffffffff) * (ulong)uVar19;
  auVar28._8_8_ =
       (auVar31._8_8_ >> 0x1a) +
       (uVar7 & 0xffffffff) * (ulong)uVar22 +
       (uVar1 & 0xffffffff) * (ulong)uVar14 + (uVar2 & 0xffffffff) * (ulong)uVar12 +
       (uVar3 & 0xffffffff) * (ulong)uVar10 + (uVar8 & 0xffffffff) * (ulong)uVar20;
  auVar33._0_8_ = (auVar29._0_8_ >> 0x1a) * 5 + SUB168(auVar40 & auVar27,0);
  auVar33._8_8_ = (auVar29._8_8_ >> 0x1a) * 5 + SUB168(auVar40 & auVar27,8);
  auVar36._0_8_ = (auVar28._0_8_ >> 0x1a) + SUB168(auVar43 & auVar27,0);
  auVar36._8_8_ = (auVar28._8_8_ >> 0x1a) + SUB168(auVar43 & auVar27,8);
  lVar42 = (auVar33._8_8_ >> 0x1a) + SUB168(auVar31 & auVar27,8);
  auVar28 = auVar28 & auVar27;
  auVar34 = auVar33 & auVar27;
  lVar32 = (auVar36._8_8_ >> 0x1a) + SUB168(auVar29 & auVar27,8);
  auVar37 = auVar36 & auVar27;
  auVar39._0_8_ = auVar34._8_8_;
  auVar39._8_4_ = auVar34._8_4_;
  auVar39._12_4_ = auVar34._12_4_;
  auVar34._0_8_ = auVar39._0_8_ + auVar34._0_8_;
  auVar34._8_8_ = auVar39._8_8_ + auVar39._0_8_;
  auVar30._8_4_ = (int)lVar42;
  auVar30._0_8_ = lVar42;
  auVar30._12_4_ = (int)((ulong)lVar42 >> 0x20);
  auVar35._0_8_ = auVar28._8_8_;
  auVar35._8_4_ = auVar28._8_4_;
  auVar35._12_4_ = auVar28._12_4_;
  auVar41._0_8_ = auVar37._8_8_;
  auVar41._8_4_ = auVar37._8_4_;
  auVar41._12_4_ = auVar37._12_4_;
  auVar38._8_4_ = (int)lVar32;
  auVar38._0_8_ = lVar32;
  auVar38._12_4_ = (int)((ulong)lVar32 >> 0x20);
  auVar23._0_8_ =
       (auVar34._0_8_ >> 0x1a) + lVar42 + (auVar33._0_8_ >> 0x1a) + SUB168(auVar31 & auVar27,0);
  auVar23._8_8_ = (auVar34._8_8_ >> 0x1a) + auVar30._8_8_ + lVar42;
  auVar24._0_8_ = (auVar23._0_8_ >> 0x1a) + auVar35._0_8_ + auVar28._0_8_;
  auVar24._8_8_ = (auVar23._8_8_ >> 0x1a) + auVar35._8_8_ + auVar35._0_8_;
  auVar37._0_8_ = (auVar24._0_8_ >> 0x1a) + auVar41._0_8_ + auVar37._0_8_;
  auVar37._8_8_ = (auVar24._8_8_ >> 0x1a) + auVar41._8_8_ + auVar41._0_8_;
  auVar25._0_8_ =
       (auVar37._0_8_ >> 0x1a) + lVar32 + (auVar36._0_8_ >> 0x1a) + SUB168(auVar29 & auVar27,0);
  auVar25._8_8_ = (auVar37._8_8_ >> 0x1a) + auVar38._8_8_ + lVar32;
  auVar26._0_8_ = auVar25._0_8_ >> 0x1a;
  auVar26._8_8_ = auVar25._8_8_ >> 0x1a;
  auVar39 = pblendw((undefined1  [16])0x0,auVar26,0x33);
  (*out)[0] = auVar39._0_8_ * 5 + SUB168(auVar34 & auVar27,0);
  (*out)[1] = auVar39._8_8_ * 5 + SUB168(auVar34 & auVar27,8);
  out[1] = (Lib_IntVector_Intrinsics_vec128)(auVar23 & auVar27);
  out[2] = (Lib_IntVector_Intrinsics_vec128)(auVar24 & auVar27);
  out[3] = (Lib_IntVector_Intrinsics_vec128)(auVar37 & auVar27);
  out[4] = (Lib_IntVector_Intrinsics_vec128)(auVar27 & auVar25);
  return;
}

Assistant:

void
Hacl_MAC_Poly1305_Simd128_fmul_r2_normalize(
  Lib_IntVector_Intrinsics_vec128 *out,
  Lib_IntVector_Intrinsics_vec128 *p
)
{
  Lib_IntVector_Intrinsics_vec128 *r = p;
  Lib_IntVector_Intrinsics_vec128 *r2 = p + 10U;
  Lib_IntVector_Intrinsics_vec128 a0 = out[0U];
  Lib_IntVector_Intrinsics_vec128 a1 = out[1U];
  Lib_IntVector_Intrinsics_vec128 a2 = out[2U];
  Lib_IntVector_Intrinsics_vec128 a3 = out[3U];
  Lib_IntVector_Intrinsics_vec128 a4 = out[4U];
  Lib_IntVector_Intrinsics_vec128 r10 = r[0U];
  Lib_IntVector_Intrinsics_vec128 r11 = r[1U];
  Lib_IntVector_Intrinsics_vec128 r12 = r[2U];
  Lib_IntVector_Intrinsics_vec128 r13 = r[3U];
  Lib_IntVector_Intrinsics_vec128 r14 = r[4U];
  Lib_IntVector_Intrinsics_vec128 r20 = r2[0U];
  Lib_IntVector_Intrinsics_vec128 r21 = r2[1U];
  Lib_IntVector_Intrinsics_vec128 r22 = r2[2U];
  Lib_IntVector_Intrinsics_vec128 r23 = r2[3U];
  Lib_IntVector_Intrinsics_vec128 r24 = r2[4U];
  Lib_IntVector_Intrinsics_vec128
  r201 = Lib_IntVector_Intrinsics_vec128_interleave_low64(r20, r10);
  Lib_IntVector_Intrinsics_vec128
  r211 = Lib_IntVector_Intrinsics_vec128_interleave_low64(r21, r11);
  Lib_IntVector_Intrinsics_vec128
  r221 = Lib_IntVector_Intrinsics_vec128_interleave_low64(r22, r12);
  Lib_IntVector_Intrinsics_vec128
  r231 = Lib_IntVector_Intrinsics_vec128_interleave_low64(r23, r13);
  Lib_IntVector_Intrinsics_vec128
  r241 = Lib_IntVector_Intrinsics_vec128_interleave_low64(r24, r14);
  Lib_IntVector_Intrinsics_vec128 r251 = Lib_IntVector_Intrinsics_vec128_smul64(r211, 5ULL);
  Lib_IntVector_Intrinsics_vec128 r252 = Lib_IntVector_Intrinsics_vec128_smul64(r221, 5ULL);
  Lib_IntVector_Intrinsics_vec128 r253 = Lib_IntVector_Intrinsics_vec128_smul64(r231, 5ULL);
  Lib_IntVector_Intrinsics_vec128 r254 = Lib_IntVector_Intrinsics_vec128_smul64(r241, 5ULL);
  Lib_IntVector_Intrinsics_vec128 a01 = Lib_IntVector_Intrinsics_vec128_mul64(r201, a0);
  Lib_IntVector_Intrinsics_vec128 a11 = Lib_IntVector_Intrinsics_vec128_mul64(r211, a0);
  Lib_IntVector_Intrinsics_vec128 a21 = Lib_IntVector_Intrinsics_vec128_mul64(r221, a0);
  Lib_IntVector_Intrinsics_vec128 a31 = Lib_IntVector_Intrinsics_vec128_mul64(r231, a0);
  Lib_IntVector_Intrinsics_vec128 a41 = Lib_IntVector_Intrinsics_vec128_mul64(r241, a0);
  Lib_IntVector_Intrinsics_vec128
  a02 =
    Lib_IntVector_Intrinsics_vec128_add64(a01,
      Lib_IntVector_Intrinsics_vec128_mul64(r254, a1));
  Lib_IntVector_Intrinsics_vec128
  a12 =
    Lib_IntVector_Intrinsics_vec128_add64(a11,
      Lib_IntVector_Intrinsics_vec128_mul64(r201, a1));
  Lib_IntVector_Intrinsics_vec128
  a22 =
    Lib_IntVector_Intrinsics_vec128_add64(a21,
      Lib_IntVector_Intrinsics_vec128_mul64(r211, a1));
  Lib_IntVector_Intrinsics_vec128
  a32 =
    Lib_IntVector_Intrinsics_vec128_add64(a31,
      Lib_IntVector_Intrinsics_vec128_mul64(r221, a1));
  Lib_IntVector_Intrinsics_vec128
  a42 =
    Lib_IntVector_Intrinsics_vec128_add64(a41,
      Lib_IntVector_Intrinsics_vec128_mul64(r231, a1));
  Lib_IntVector_Intrinsics_vec128
  a03 =
    Lib_IntVector_Intrinsics_vec128_add64(a02,
      Lib_IntVector_Intrinsics_vec128_mul64(r253, a2));
  Lib_IntVector_Intrinsics_vec128
  a13 =
    Lib_IntVector_Intrinsics_vec128_add64(a12,
      Lib_IntVector_Intrinsics_vec128_mul64(r254, a2));
  Lib_IntVector_Intrinsics_vec128
  a23 =
    Lib_IntVector_Intrinsics_vec128_add64(a22,
      Lib_IntVector_Intrinsics_vec128_mul64(r201, a2));
  Lib_IntVector_Intrinsics_vec128
  a33 =
    Lib_IntVector_Intrinsics_vec128_add64(a32,
      Lib_IntVector_Intrinsics_vec128_mul64(r211, a2));
  Lib_IntVector_Intrinsics_vec128
  a43 =
    Lib_IntVector_Intrinsics_vec128_add64(a42,
      Lib_IntVector_Intrinsics_vec128_mul64(r221, a2));
  Lib_IntVector_Intrinsics_vec128
  a04 =
    Lib_IntVector_Intrinsics_vec128_add64(a03,
      Lib_IntVector_Intrinsics_vec128_mul64(r252, a3));
  Lib_IntVector_Intrinsics_vec128
  a14 =
    Lib_IntVector_Intrinsics_vec128_add64(a13,
      Lib_IntVector_Intrinsics_vec128_mul64(r253, a3));
  Lib_IntVector_Intrinsics_vec128
  a24 =
    Lib_IntVector_Intrinsics_vec128_add64(a23,
      Lib_IntVector_Intrinsics_vec128_mul64(r254, a3));
  Lib_IntVector_Intrinsics_vec128
  a34 =
    Lib_IntVector_Intrinsics_vec128_add64(a33,
      Lib_IntVector_Intrinsics_vec128_mul64(r201, a3));
  Lib_IntVector_Intrinsics_vec128
  a44 =
    Lib_IntVector_Intrinsics_vec128_add64(a43,
      Lib_IntVector_Intrinsics_vec128_mul64(r211, a3));
  Lib_IntVector_Intrinsics_vec128
  a05 =
    Lib_IntVector_Intrinsics_vec128_add64(a04,
      Lib_IntVector_Intrinsics_vec128_mul64(r251, a4));
  Lib_IntVector_Intrinsics_vec128
  a15 =
    Lib_IntVector_Intrinsics_vec128_add64(a14,
      Lib_IntVector_Intrinsics_vec128_mul64(r252, a4));
  Lib_IntVector_Intrinsics_vec128
  a25 =
    Lib_IntVector_Intrinsics_vec128_add64(a24,
      Lib_IntVector_Intrinsics_vec128_mul64(r253, a4));
  Lib_IntVector_Intrinsics_vec128
  a35 =
    Lib_IntVector_Intrinsics_vec128_add64(a34,
      Lib_IntVector_Intrinsics_vec128_mul64(r254, a4));
  Lib_IntVector_Intrinsics_vec128
  a45 =
    Lib_IntVector_Intrinsics_vec128_add64(a44,
      Lib_IntVector_Intrinsics_vec128_mul64(r201, a4));
  Lib_IntVector_Intrinsics_vec128 t0 = a05;
  Lib_IntVector_Intrinsics_vec128 t1 = a15;
  Lib_IntVector_Intrinsics_vec128 t2 = a25;
  Lib_IntVector_Intrinsics_vec128 t3 = a35;
  Lib_IntVector_Intrinsics_vec128 t4 = a45;
  Lib_IntVector_Intrinsics_vec128 mask26 = Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL);
  Lib_IntVector_Intrinsics_vec128 z0 = Lib_IntVector_Intrinsics_vec128_shift_right64(t0, 26U);
  Lib_IntVector_Intrinsics_vec128 z1 = Lib_IntVector_Intrinsics_vec128_shift_right64(t3, 26U);
  Lib_IntVector_Intrinsics_vec128 x0 = Lib_IntVector_Intrinsics_vec128_and(t0, mask26);
  Lib_IntVector_Intrinsics_vec128 x3 = Lib_IntVector_Intrinsics_vec128_and(t3, mask26);
  Lib_IntVector_Intrinsics_vec128 x1 = Lib_IntVector_Intrinsics_vec128_add64(t1, z0);
  Lib_IntVector_Intrinsics_vec128 x4 = Lib_IntVector_Intrinsics_vec128_add64(t4, z1);
  Lib_IntVector_Intrinsics_vec128 z01 = Lib_IntVector_Intrinsics_vec128_shift_right64(x1, 26U);
  Lib_IntVector_Intrinsics_vec128 z11 = Lib_IntVector_Intrinsics_vec128_shift_right64(x4, 26U);
  Lib_IntVector_Intrinsics_vec128 t = Lib_IntVector_Intrinsics_vec128_shift_left64(z11, 2U);
  Lib_IntVector_Intrinsics_vec128 z12 = Lib_IntVector_Intrinsics_vec128_add64(z11, t);
  Lib_IntVector_Intrinsics_vec128 x11 = Lib_IntVector_Intrinsics_vec128_and(x1, mask26);
  Lib_IntVector_Intrinsics_vec128 x41 = Lib_IntVector_Intrinsics_vec128_and(x4, mask26);
  Lib_IntVector_Intrinsics_vec128 x2 = Lib_IntVector_Intrinsics_vec128_add64(t2, z01);
  Lib_IntVector_Intrinsics_vec128 x01 = Lib_IntVector_Intrinsics_vec128_add64(x0, z12);
  Lib_IntVector_Intrinsics_vec128 z02 = Lib_IntVector_Intrinsics_vec128_shift_right64(x2, 26U);
  Lib_IntVector_Intrinsics_vec128 z13 = Lib_IntVector_Intrinsics_vec128_shift_right64(x01, 26U);
  Lib_IntVector_Intrinsics_vec128 x21 = Lib_IntVector_Intrinsics_vec128_and(x2, mask26);
  Lib_IntVector_Intrinsics_vec128 x02 = Lib_IntVector_Intrinsics_vec128_and(x01, mask26);
  Lib_IntVector_Intrinsics_vec128 x31 = Lib_IntVector_Intrinsics_vec128_add64(x3, z02);
  Lib_IntVector_Intrinsics_vec128 x12 = Lib_IntVector_Intrinsics_vec128_add64(x11, z13);
  Lib_IntVector_Intrinsics_vec128 z03 = Lib_IntVector_Intrinsics_vec128_shift_right64(x31, 26U);
  Lib_IntVector_Intrinsics_vec128 x32 = Lib_IntVector_Intrinsics_vec128_and(x31, mask26);
  Lib_IntVector_Intrinsics_vec128 x42 = Lib_IntVector_Intrinsics_vec128_add64(x41, z03);
  Lib_IntVector_Intrinsics_vec128 o0 = x02;
  Lib_IntVector_Intrinsics_vec128 o10 = x12;
  Lib_IntVector_Intrinsics_vec128 o20 = x21;
  Lib_IntVector_Intrinsics_vec128 o30 = x32;
  Lib_IntVector_Intrinsics_vec128 o40 = x42;
  Lib_IntVector_Intrinsics_vec128
  o01 =
    Lib_IntVector_Intrinsics_vec128_add64(o0,
      Lib_IntVector_Intrinsics_vec128_interleave_high64(o0, o0));
  Lib_IntVector_Intrinsics_vec128
  o11 =
    Lib_IntVector_Intrinsics_vec128_add64(o10,
      Lib_IntVector_Intrinsics_vec128_interleave_high64(o10, o10));
  Lib_IntVector_Intrinsics_vec128
  o21 =
    Lib_IntVector_Intrinsics_vec128_add64(o20,
      Lib_IntVector_Intrinsics_vec128_interleave_high64(o20, o20));
  Lib_IntVector_Intrinsics_vec128
  o31 =
    Lib_IntVector_Intrinsics_vec128_add64(o30,
      Lib_IntVector_Intrinsics_vec128_interleave_high64(o30, o30));
  Lib_IntVector_Intrinsics_vec128
  o41 =
    Lib_IntVector_Intrinsics_vec128_add64(o40,
      Lib_IntVector_Intrinsics_vec128_interleave_high64(o40, o40));
  Lib_IntVector_Intrinsics_vec128
  l = Lib_IntVector_Intrinsics_vec128_add64(o01, Lib_IntVector_Intrinsics_vec128_zero);
  Lib_IntVector_Intrinsics_vec128
  tmp0 =
    Lib_IntVector_Intrinsics_vec128_and(l,
      Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec128 c0 = Lib_IntVector_Intrinsics_vec128_shift_right64(l, 26U);
  Lib_IntVector_Intrinsics_vec128 l0 = Lib_IntVector_Intrinsics_vec128_add64(o11, c0);
  Lib_IntVector_Intrinsics_vec128
  tmp1 =
    Lib_IntVector_Intrinsics_vec128_and(l0,
      Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec128 c1 = Lib_IntVector_Intrinsics_vec128_shift_right64(l0, 26U);
  Lib_IntVector_Intrinsics_vec128 l1 = Lib_IntVector_Intrinsics_vec128_add64(o21, c1);
  Lib_IntVector_Intrinsics_vec128
  tmp2 =
    Lib_IntVector_Intrinsics_vec128_and(l1,
      Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec128 c2 = Lib_IntVector_Intrinsics_vec128_shift_right64(l1, 26U);
  Lib_IntVector_Intrinsics_vec128 l2 = Lib_IntVector_Intrinsics_vec128_add64(o31, c2);
  Lib_IntVector_Intrinsics_vec128
  tmp3 =
    Lib_IntVector_Intrinsics_vec128_and(l2,
      Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec128 c3 = Lib_IntVector_Intrinsics_vec128_shift_right64(l2, 26U);
  Lib_IntVector_Intrinsics_vec128 l3 = Lib_IntVector_Intrinsics_vec128_add64(o41, c3);
  Lib_IntVector_Intrinsics_vec128
  tmp4 =
    Lib_IntVector_Intrinsics_vec128_and(l3,
      Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec128 c4 = Lib_IntVector_Intrinsics_vec128_shift_right64(l3, 26U);
  Lib_IntVector_Intrinsics_vec128
  o00 =
    Lib_IntVector_Intrinsics_vec128_add64(tmp0,
      Lib_IntVector_Intrinsics_vec128_smul64(c4, 5ULL));
  Lib_IntVector_Intrinsics_vec128 o1 = tmp1;
  Lib_IntVector_Intrinsics_vec128 o2 = tmp2;
  Lib_IntVector_Intrinsics_vec128 o3 = tmp3;
  Lib_IntVector_Intrinsics_vec128 o4 = tmp4;
  out[0U] = o00;
  out[1U] = o1;
  out[2U] = o2;
  out[3U] = o3;
  out[4U] = o4;
}